

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::emit_custom_templates(CompilerMSL *this)

{
  bool bVar1;
  reference pSVar2;
  SPVFuncImpl *spv_func;
  iterator __end1;
  iterator __begin1;
  set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
  *__range1;
  CompilerMSL *this_local;
  
  __end1 = ::std::
           set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
           ::begin(&this->spv_function_implementations);
  spv_func = (SPVFuncImpl *)
             ::std::
             set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
             ::end(&this->spv_function_implementations);
  while (bVar1 = ::std::operator!=(&__end1,(_Self *)&spv_func), bVar1) {
    pSVar2 = ::std::_Rb_tree_const_iterator<spirv_cross::CompilerMSL::SPVFuncImpl>::operator*
                       (&__end1);
    if (*pSVar2 == SPVFuncImplUnsafeArray) {
      CompilerGLSL::statement<char_const(&)[33]>
                (&this->super_CompilerGLSL,(char (*) [33])"template<typename T, size_t Num>");
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"struct spvUnsafeArray");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[27]>
                (&this->super_CompilerGLSL,(char (*) [27])"T elements[Num ? Num : 1];");
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x4d8596);
      CompilerGLSL::statement<char_const(&)[42]>
                (&this->super_CompilerGLSL,
                 (char (*) [42])"thread T& operator [] (size_t pos) thread");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[64]>
                (&this->super_CompilerGLSL,
                 (char (*) [64])"constexpr const thread T& operator [] (size_t pos) const thread");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x4d8596);
      CompilerGLSL::statement<char_const(&)[42]>
                (&this->super_CompilerGLSL,
                 (char (*) [42])"device T& operator [] (size_t pos) device");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[64]>
                (&this->super_CompilerGLSL,
                 (char (*) [64])"constexpr const device T& operator [] (size_t pos) const device");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x4d8596);
      CompilerGLSL::statement<char_const(&)[68]>
                (&this->super_CompilerGLSL,
                 (char (*) [68])
                 "constexpr const constant T& operator [] (size_t pos) const constant");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x4d8596);
      CompilerGLSL::statement<char_const(&)[52]>
                (&this->super_CompilerGLSL,
                 (char (*) [52])"threadgroup T& operator [] (size_t pos) threadgroup");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[74]>
                (&this->super_CompilerGLSL,
                 (char (*) [74])
                 "constexpr const threadgroup T& operator [] (size_t pos) const threadgroup");
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[22]>
                (&this->super_CompilerGLSL,(char (*) [22])"return elements[pos];");
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x4d8596);
    }
    ::std::_Rb_tree_const_iterator<spirv_cross::CompilerMSL::SPVFuncImpl>::operator++(&__end1);
  }
  return;
}

Assistant:

void CompilerMSL::emit_custom_templates()
{
	for (const auto &spv_func : spv_function_implementations)
	{
		switch (spv_func)
		{
		case SPVFuncImplUnsafeArray:
			statement("template<typename T, size_t Num>");
			statement("struct spvUnsafeArray");
			begin_scope();
			statement("T elements[Num ? Num : 1];");
			statement("");
			statement("thread T& operator [] (size_t pos) thread");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("constexpr const thread T& operator [] (size_t pos) const thread");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("");
			statement("device T& operator [] (size_t pos) device");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("constexpr const device T& operator [] (size_t pos) const device");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("");
			statement("constexpr const constant T& operator [] (size_t pos) const constant");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("");
			statement("threadgroup T& operator [] (size_t pos) threadgroup");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			statement("constexpr const threadgroup T& operator [] (size_t pos) const threadgroup");
			begin_scope();
			statement("return elements[pos];");
			end_scope();
			end_scope_decl();
			statement("");
			break;

		default:
			break;
		}
	}
}